

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natwm.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  natwm_error nVar2;
  map *pmVar3;
  xcb_connection_t *pxVar4;
  xcb_screen_t *pxVar5;
  xcb_ewmh_connection_t *pxVar6;
  button_state *pbVar7;
  theme *ptVar8;
  pthread_t local_40;
  pthread_t wm_events_thread;
  void *wm_events_result;
  natwm_state *state;
  argument_options *arg_options;
  char **ppcStack_18;
  int screen_num;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  arg_options._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  state = (natwm_state *)parse_arguments(argc,argv);
  if (state == (natwm_state *)0x0) {
    fprintf(_stderr,"Failed to parse command line arguments");
    exit(1);
  }
  initialize_logger((_Bool)(*(_Bool *)&state->ewmh & 1));
  wm_events_result = natwm_state_create();
  if ((natwm_state *)wm_events_result != (natwm_state *)0x0) {
    ((natwm_state *)wm_events_result)->screen_num = arg_options._4_4_;
    if (*(long *)state != 0) {
      ((natwm_state *)wm_events_result)->config_path = *(char **)state;
    }
    pmVar3 = config_initialize_path(((natwm_state *)wm_events_result)->config_path);
    *(map **)((long)wm_events_result + 0x38) = pmVar3;
    if (*(long *)((long)wm_events_result + 0x38) != 0) {
      iVar1 = install_signal_handlers();
      if (iVar1 != 0) {
        internal_logger(natwm_logger,LEVEL_ERROR,
                        "Failed to handle signals - This may cause problems!");
      }
      pxVar4 = make_connection((char *)state->xcb,(int *)((long)&arg_options + 4));
      *(xcb_connection_t **)((long)wm_events_result + 8) = pxVar4;
      if (*(long *)((long)wm_events_result + 8) != 0) {
        internal_logger(natwm_logger,LEVEL_INFO,"Successfully connected to X server");
        pxVar5 = find_default_screen(*(xcb_connection_t **)((long)wm_events_result + 8),
                                     arg_options._4_4_);
        *(xcb_screen_t **)((long)wm_events_result + 0x18) = pxVar5;
        if (*(long *)((long)wm_events_result + 0x18) == 0) {
          internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find default screen");
        }
        else {
          nVar2 = event_subscribe_to_root((natwm_state *)wm_events_result);
          if (nVar2 == NO_ERROR) {
            pxVar6 = ewmh_create(*(xcb_connection_t **)((long)wm_events_result + 8));
            *(xcb_ewmh_connection_t **)((long)wm_events_result + 0x10) = pxVar6;
            if (*(long *)((long)wm_events_result + 0x10) == 0) {
              internal_logger(natwm_logger,LEVEL_ERROR,"Failed to setup monitor");
            }
            else {
              ewmh_init((natwm_state *)wm_events_result);
              pbVar7 = button_state_create(*(xcb_connection_t **)((long)wm_events_result + 8));
              *(button_state **)((long)wm_events_result + 0x20) = pbVar7;
              if (*(long *)((long)wm_events_result + 0x20) == 0) {
                internal_logger(natwm_logger,LEVEL_ERROR,"Failed to initialize button state");
              }
              else {
                nVar2 = monitor_setup((natwm_state *)wm_events_result,
                                      (monitor_list **)((long)wm_events_result + 0x28));
                if (nVar2 == NO_ERROR) {
                  nVar2 = workspace_list_init((natwm_state *)wm_events_result,
                                              (workspace_list **)((long)wm_events_result + 0x30));
                  if (nVar2 == NO_ERROR) {
                    ptVar8 = theme_create(*(map **)((long)wm_events_result + 0x38));
                    *(theme **)(*(long *)((long)wm_events_result + 0x30) + 0x10) = ptVar8;
                    if (*(long *)(*(long *)((long)wm_events_result + 0x30) + 0x10) == 0) {
                      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to initialize client theme");
                    }
                    else {
                      status = 0;
                      wm_events_thread = 0;
                      pthread_create(&local_40,(pthread_attr_t *)0x0,wm_event_loop,wm_events_result)
                      ;
                      pthread_join(local_40,(void **)&wm_events_thread);
                      if (wm_events_thread == 0) {
                        free(state);
                        natwm_state_destroy((natwm_state *)wm_events_result);
                        destroy_logger(natwm_logger);
                        return 0;
                      }
                    }
                  }
                  else {
                    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to setup workspaces");
                  }
                }
                else {
                  internal_logger(natwm_logger,LEVEL_ERROR,"Failed to setup monitor");
                }
              }
            }
          }
          else {
            internal_logger(natwm_logger,LEVEL_ERROR,
                            "Failed to subscribe to root events: Other window manager is present");
          }
        }
      }
    }
    internal_logger(natwm_logger,LEVEL_CRITICAL,"Encountered error. Closing...");
    free(state);
    natwm_state_destroy((natwm_state *)wm_events_result);
    destroy_logger(natwm_logger);
    return 1;
  }
  internal_logger(natwm_logger,LEVEL_CRITICAL,"Failed to initialize applicaiton state");
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
        int screen_num = 0;
        struct argument_options *arg_options = parse_arguments(argc, argv);

        if (arg_options == NULL) {
                fprintf(stderr, "Failed to parse command line arguments");

                exit(EXIT_FAILURE);
        }

        // Initialize the logger
        initialize_logger(arg_options->verbose);

        // Initialize program state
        struct natwm_state *state = natwm_state_create();

        if (state == NULL) {
                LOG_CRITICAL(natwm_logger, "Failed to initialize applicaiton state");

                exit(EXIT_FAILURE);
        }

        state->screen_num = screen_num;

        // Initialize config
        if (arg_options->config_path) {
                state->config_path = arg_options->config_path;
        }

        state->config = config_initialize_path(state->config_path);

        if (state->config == NULL) {
                goto free_and_error;
        }

        // Catch and handle signals
        if (install_signal_handlers() != 0) {
                LOG_ERROR(natwm_logger, "Failed to handle signals - This may cause problems!");
        }

        // Initialize x
        state->xcb = make_connection(arg_options->screen, &screen_num);

        if (state->xcb == NULL) {
                goto free_and_error;
        }

        LOG_INFO(natwm_logger, "Successfully connected to X server");

        // Find the default screen
        state->screen = find_default_screen(state->xcb, screen_num);

        if (state->screen == NULL) {
                LOG_ERROR(natwm_logger, "Failed to find default screen");

                goto free_and_error;
        }

        // Attempt to register for substructure events
        if (event_subscribe_to_root(state) != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Failed to subscribe to root events: Other window "
                          "manager is present");

                goto free_and_error;
        }

        state->ewmh = ewmh_create(state->xcb);

        if (state->ewmh == NULL) {
                LOG_ERROR(natwm_logger, "Failed to setup monitor");

                goto free_and_error;
        }

        // Initialize ewmh hinting
        ewmh_init(state);

        state->button_state = button_state_create(state->xcb);

        if (state->button_state == NULL) {
                LOG_ERROR(natwm_logger, "Failed to initialize button state");

                goto free_and_error;
        }

        if (monitor_setup(state, &state->monitor_list) != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Failed to setup monitor");

                goto free_and_error;
        }

        if (workspace_list_init(state, &state->workspace_list) != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Failed to setup workspaces");

                goto free_and_error;
        }

        // Before we can start registering clients we need to load the theme
        // from the configuration file. This will save us trips to the config
        // map when registering clients.
        //
        // TODO: Set defaults so we don't have a hard requirement on the user
        // settings these in their configuration
        state->workspace_list->theme = theme_create(state->config);

        if (state->workspace_list->theme == NULL) {
                LOG_ERROR(natwm_logger, "Failed to initialize client theme");

                goto free_and_error;
        }

        status = RUNNING;

        // Start wm thread
        void *wm_events_result = NULL;
        pthread_t wm_events_thread;

        pthread_create(&wm_events_thread, NULL, wm_event_loop, state);
        pthread_join(wm_events_thread, &wm_events_result);

        if ((intptr_t)wm_events_result != 0) {
                goto free_and_error;
        }

        free(arg_options);
        natwm_state_destroy(state);
        destroy_logger(natwm_logger);

        return EXIT_SUCCESS;

free_and_error:
        LOG_CRITICAL(natwm_logger, "Encountered error. Closing...");

        free(arg_options);
        natwm_state_destroy(state);
        destroy_logger(natwm_logger);

        return EXIT_FAILURE;
}